

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  ImGuiDockNode *this;
  bool bVar1;
  ImGuiDockContext *dc_00;
  ImGuiStoragePair *pIVar2;
  ImGuiDockNodeSettings *pIVar3;
  char *pcVar4;
  char local_71;
  char *local_70;
  ImGuiDockNodeSettings *node_settings;
  int line_start_pos;
  int node_n_1;
  int node_n;
  int max_depth;
  ImGuiDockNode *node;
  int n;
  ImGuiDockContext *dc;
  ImGuiContext *g;
  ImGuiTextBuffer *buf_local;
  ImGuiSettingsHandler *handler_local;
  ImGuiContext *ctx_local;
  
  dc_00 = &ctx->DockContext;
  if (((ctx->IO).ConfigFlags & 0x40U) != 0) {
    ImVector<ImGuiDockNodeSettings>::resize(&(ctx->DockContext).NodesSettings,0);
    ImVector<ImGuiDockNodeSettings>::reserve
              (&(ctx->DockContext).NodesSettings,(dc_00->Nodes).Data.Size);
    for (node._4_4_ = 0; node._4_4_ < (dc_00->Nodes).Data.Size; node._4_4_ = node._4_4_ + 1) {
      pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                         ((ImVector<ImGuiStorage::ImGuiStoragePair> *)dc_00,node._4_4_);
      this = (ImGuiDockNode *)(pIVar2->field_1).val_p;
      if ((this != (ImGuiDockNode *)0x0) && (bVar1 = ImGuiDockNode::IsRootNode(this), bVar1)) {
        DockSettingsHandler_DockNodeToSettings(dc_00,this,0);
      }
    }
    node_n_1 = 0;
    for (line_start_pos = 0; line_start_pos < (ctx->DockContext).NodesSettings.Size;
        line_start_pos = line_start_pos + 1) {
      pIVar3 = ImVector<ImGuiDockNodeSettings>::operator[]
                         (&(ctx->DockContext).NodesSettings,line_start_pos);
      node_n_1 = ImMax<int>((int)pIVar3->Depth,node_n_1);
    }
    ImGuiTextBuffer::appendf(buf,"[%s][Data]\n",handler->TypeName);
    for (node_settings._4_4_ = 0; node_settings._4_4_ < (ctx->DockContext).NodesSettings.Size;
        node_settings._4_4_ = node_settings._4_4_ + 1) {
      ImGuiTextBuffer::size(buf);
      pIVar3 = ImVector<ImGuiDockNodeSettings>::operator[]
                         (&(ctx->DockContext).NodesSettings,node_settings._4_4_);
      if ((pIVar3->Flags & 0x400U) == 0) {
        local_70 = "DockNode ";
      }
      else {
        local_70 = "DockSpace";
      }
      pcVar4 = "";
      ImGuiTextBuffer::appendf
                (buf,"%*s%s%*s",(ulong)(uint)((int)pIVar3->Depth << 1),"",local_70,
                 (ulong)(uint)((node_n_1 - pIVar3->Depth) * 2),"");
      ImGuiTextBuffer::appendf(buf," ID=0x%08X",(ulong)pIVar3->ID);
      if (pIVar3->ParentNodeId == 0) {
        if (pIVar3->ParentWindowId != 0) {
          ImGuiTextBuffer::appendf(buf," Window=0x%08X",(ulong)pIVar3->ParentWindowId);
        }
        ImGuiTextBuffer::appendf
                  (buf," Pos=%d,%d Size=%d,%d",(ulong)(uint)(int)(pIVar3->Pos).x,
                   (ulong)(uint)(int)(pIVar3->Pos).y,(ulong)(uint)(int)(pIVar3->Size).x,
                   (ulong)(uint)(int)(pIVar3->Size).y,pcVar4);
      }
      else {
        ImGuiTextBuffer::appendf
                  (buf," Parent=0x%08X SizeRef=%d,%d",(ulong)pIVar3->ParentNodeId,
                   (ulong)(uint)(int)(pIVar3->SizeRef).x,(ulong)(uint)(int)(pIVar3->SizeRef).y);
      }
      if (pIVar3->SplitAxis != -1) {
        local_71 = 'X';
        if (pIVar3->SplitAxis != '\0') {
          local_71 = 'Y';
        }
        ImGuiTextBuffer::appendf(buf," Split=%c",(ulong)(uint)(int)local_71);
      }
      if ((pIVar3->Flags & 0x20U) != 0) {
        ImGuiTextBuffer::appendf(buf," NoResize=1");
      }
      if ((pIVar3->Flags & 0x800U) != 0) {
        ImGuiTextBuffer::appendf(buf," CentralNode=1");
      }
      if ((pIVar3->Flags & 0x1000U) != 0) {
        ImGuiTextBuffer::appendf(buf," NoTabBar=1");
      }
      if ((pIVar3->Flags & 0x2000U) != 0) {
        ImGuiTextBuffer::appendf(buf," HiddenTabBar=1");
      }
      if ((pIVar3->Flags & 0x4000U) != 0) {
        ImGuiTextBuffer::appendf(buf," NoWindowMenuButton=1");
      }
      if ((pIVar3->Flags & 0x8000U) != 0) {
        ImGuiTextBuffer::appendf(buf," NoCloseButton=1");
      }
      if (pIVar3->SelectedWindowId != 0) {
        ImGuiTextBuffer::appendf(buf," Selected=0x%08X",(ulong)pIVar3->SelectedWindowId);
      }
      ImGuiTextBuffer::appendf(buf,"\n");
    }
    ImGuiTextBuffer::appendf(buf,"\n");
  }
  return;
}

Assistant:

static void ImGui::DockSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Gather settings data
    // (unlike our windows settings, because nodes are always built we can do a full rewrite of the SettingsNode buffer)
    dc->NodesSettings.resize(0);
    dc->NodesSettings.reserve(dc->Nodes.Data.Size);
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsRootNode())
                DockSettingsHandler_DockNodeToSettings(dc, node, 0);

    int max_depth = 0;
    for (int node_n = 0; node_n < dc->NodesSettings.Size; node_n++)
        max_depth = ImMax((int)dc->NodesSettings[node_n].Depth, max_depth);

    // Write to text buffer
    buf->appendf("[%s][Data]\n", handler->TypeName);
    for (int node_n = 0; node_n < dc->NodesSettings.Size; node_n++)
    {
        const int line_start_pos = buf->size(); (void)line_start_pos;
        const ImGuiDockNodeSettings* node_settings = &dc->NodesSettings[node_n];
        buf->appendf("%*s%s%*s", node_settings->Depth * 2, "", (node_settings->Flags & ImGuiDockNodeFlags_DockSpace) ? "DockSpace" : "DockNode ", (max_depth - node_settings->Depth) * 2, "");  // Text align nodes to facilitate looking at .ini file
        buf->appendf(" ID=0x%08X", node_settings->ID);
        if (node_settings->ParentNodeId)
        {
            buf->appendf(" Parent=0x%08X SizeRef=%d,%d", node_settings->ParentNodeId, node_settings->SizeRef.x, node_settings->SizeRef.y);
        }
        else
        {
            if (node_settings->ParentWindowId)
                buf->appendf(" Window=0x%08X", node_settings->ParentWindowId);
            buf->appendf(" Pos=%d,%d Size=%d,%d", node_settings->Pos.x, node_settings->Pos.y, node_settings->Size.x, node_settings->Size.y);
        }
        if (node_settings->SplitAxis != ImGuiAxis_None)
            buf->appendf(" Split=%c", (node_settings->SplitAxis == ImGuiAxis_X) ? 'X' : 'Y');
        if (node_settings->Flags & ImGuiDockNodeFlags_NoResize)
            buf->appendf(" NoResize=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_CentralNode)
            buf->appendf(" CentralNode=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoTabBar)
            buf->appendf(" NoTabBar=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_HiddenTabBar)
            buf->appendf(" HiddenTabBar=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoWindowMenuButton)
            buf->appendf(" NoWindowMenuButton=1");
        if (node_settings->Flags & ImGuiDockNodeFlags_NoCloseButton)
            buf->appendf(" NoCloseButton=1");
        if (node_settings->SelectedWindowId)
            buf->appendf(" Selected=0x%08X", node_settings->SelectedWindowId);

#if IMGUI_DEBUG_INI_SETTINGS
        // [DEBUG] Include comments in the .ini file to ease debugging
        if (ImGuiDockNode* node = DockContextFindNodeByID(ctx, node_settings->ID))
        {
            buf->appendf("%*s", ImMax(2, (line_start_pos + 92) - buf->size()), "");     // Align everything
            if (node->IsDockSpace() && node->HostWindow && node->HostWindow->ParentWindow)
                buf->appendf(" ; in '%s'", node->HostWindow->ParentWindow->Name);
            // Iterate settings so we can give info about windows that didn't exist during the session.
            int contains_window = 0;
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                if (settings->DockId == node_settings->ID)
                {
                    if (contains_window++ == 0)
                        buf->appendf(" ; contains ");
                    buf->appendf("'%s' ", settings->GetName());
                }
        }
#endif
        buf->appendf("\n");
    }
    buf->appendf("\n");
}